

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_tet_ratio_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_ratio,REF_DBL *max_ratio)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  bool bVar2;
  REF_INT local_ec;
  REF_DBL local_e8;
  REF_DBL local_e0;
  REF_INT local_d8;
  int local_d4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_INT local_b8;
  REF_BOOL none_found;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *max_ratio_local;
  REF_DBL *min_ratio_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  ratio._4_4_ = 1;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_cell_00->ref_adj->first[node];
  }
  cell_node = local_d4;
  if (local_d4 == -1) {
    local_d8 = -1;
  }
  else {
    local_d8 = ref_cell_00->ref_adj->item[local_d4].ref;
  }
  nodes[0x1a] = local_d8;
  while( true ) {
    if (cell_node == -1) {
      bVar2 = ratio._4_4_ != 0;
      if (bVar2) {
        *min_ratio = 2000.0;
        *max_ratio = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x518,"ref_smooth_tet_ratio_around","no tet found, can not compute ratio");
      }
      ref_grid_local._4_4_ = (uint)bVar2;
      return ref_grid_local._4_4_;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],&local_b8);
    if (uVar1 != 0) break;
    for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->node_per; nodes[0x19] = nodes[0x19] + 1) {
      if (node != (&local_b8)[nodes[0x19]]) {
        uVar1 = ref_node_ratio(ref_node_00,node,(&local_b8)[nodes[0x19]],
                               (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x508,"ref_smooth_tet_ratio_around",(ulong)uVar1,"ratio");
          return uVar1;
        }
        if (ratio._4_4_ == 0) {
          if (_ref_private_macro_code_rss_1 <= *min_ratio) {
            local_e0 = _ref_private_macro_code_rss_1;
          }
          else {
            local_e0 = *min_ratio;
          }
          *min_ratio = local_e0;
          if (*max_ratio <= _ref_private_macro_code_rss_1) {
            local_e8 = _ref_private_macro_code_rss_1;
          }
          else {
            local_e8 = *max_ratio;
          }
          *max_ratio = local_e8;
        }
        else {
          ratio._4_4_ = 0;
          *min_ratio = _ref_private_macro_code_rss_1;
          *max_ratio = _ref_private_macro_code_rss_1;
        }
      }
    }
    cell_node = ref_cell_00->ref_adj->item[cell_node].next;
    if (cell_node == -1) {
      local_ec = -1;
    }
    else {
      local_ec = ref_cell_00->ref_adj->item[cell_node].ref;
    }
    nodes[0x1a] = local_ec;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x505,
         "ref_smooth_tet_ratio_around",(ulong)uVar1,"nodes");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_ratio_around(REF_GRID ref_grid, REF_INT node,
                                               REF_DBL *min_ratio,
                                               REF_DBL *max_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL ratio;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node != nodes[cell_node]) {
        RSS(ref_node_ratio(ref_node, node, nodes[cell_node], &ratio), "ratio");
        if (none_found) {
          none_found = REF_FALSE;
          *min_ratio = ratio;
          *max_ratio = ratio;
        } else {
          *min_ratio = MIN(*min_ratio, ratio);
          *max_ratio = MAX(*max_ratio, ratio);
        }
      }
    }
  }

  if (none_found) {
    *min_ratio = 2000.0;
    *max_ratio = -2.0;
    THROW("no tet found, can not compute ratio");
  }

  return REF_SUCCESS;
}